

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O0

Interval * tcu::operator*(Interval *__return_storage_ptr__,Interval *x,Interval *y)

{
  double dVar1;
  double dVar2;
  Interval *pIVar3;
  Interval **ppIVar4;
  double dVar5;
  double *pdVar6;
  undefined8 *puVar7;
  double *pdVar8;
  bool bVar9;
  deBool dVar10;
  float fVar11;
  Interval local_480;
  Interval local_468;
  Interval local_450;
  double local_438;
  double local_430;
  double local_428;
  Interval local_420;
  Interval *local_408;
  Interval *pIStack_400;
  Interval *local_3f8;
  Interval **local_3f0;
  Interval *point_7;
  double dStack_3e0;
  double local_3d8;
  double *local_3d0;
  Interval *point_6;
  Interval point_hi__3;
  Interval point_lo__3;
  Interval *point_dst__3;
  undefined8 *puStack_388;
  ScopedRoundingMode point_ctx__3;
  Interval *val_3;
  double yp_3;
  double local_370;
  double local_368;
  Interval *local_360;
  Interval *pIStack_358;
  Interval *local_350;
  Interval **local_348;
  Interval *point_5;
  double dStack_338;
  double local_330;
  double *local_328;
  Interval *point_4;
  Interval point_hi__2;
  Interval point_lo__2;
  Interval *point_dst__2;
  double *pdStack_2e0;
  ScopedRoundingMode point_ctx__2;
  Interval *val_2;
  double yp_2;
  double local_2c8;
  double local_2c0;
  undefined1 local_2b8 [8];
  Interval val_hi__1;
  Interval val_lo__1;
  Interval *val_dst__1;
  Interval *val_arg__1;
  Interval *tmp2__1;
  double xp_1;
  double local_250 [3];
  Interval local_238;
  Interval *local_220;
  Interval *pIStack_218;
  Interval *local_210;
  Interval **local_208;
  Interval *point_3;
  double dStack_1f8;
  double local_1f0;
  double *local_1e8;
  Interval *point_2;
  Interval point_hi__1;
  Interval point_lo__1;
  Interval *point_dst__1;
  undefined8 *puStack_1a0;
  ScopedRoundingMode point_ctx__1;
  Interval *val_1;
  double yp_1;
  double local_188;
  double local_180;
  Interval *local_178;
  Interval *pIStack_170;
  Interval *local_168;
  Interval **local_160;
  Interval *point_1;
  double dStack_150;
  double local_148;
  undefined8 *local_140;
  Interval *point;
  Interval point_hi_;
  undefined1 auStack_110 [8];
  Interval point_lo_;
  Interval *point_dst_;
  double *pdStack_e8;
  ScopedRoundingMode point_ctx_;
  Interval *val;
  double yp;
  undefined1 local_c0 [8];
  Interval val_hi_;
  Interval val_lo_;
  Interval *val_dst_;
  Interval *val_arg_;
  Interval *tmp2_;
  double xp;
  double local_68;
  double local_60;
  double local_58;
  Interval tmp2__hi_;
  Interval tmp2__lo_;
  Interval *tmp2__dst_;
  Interval *tmp2__arg_;
  Interval *y_local;
  Interval *x_local;
  
  Interval::Interval(__return_storage_ptr__);
  do {
    Interval::Interval((Interval *)&tmp2__hi_.m_hi);
    Interval::Interval((Interval *)&local_58);
    bVar9 = Interval::empty(x);
    if (bVar9) {
      Interval::Interval((Interval *)&xp);
      *(double *)__return_storage_ptr__ = xp;
      __return_storage_ptr__->m_lo = local_68;
      __return_storage_ptr__->m_hi = local_60;
    }
    else {
      dVar1 = Interval::lo(x);
      do {
        Interval::Interval((Interval *)&val_hi_.m_hi);
        Interval::Interval((Interval *)local_c0);
        bVar9 = Interval::empty(y);
        if (bVar9) {
          Interval::Interval((Interval *)&yp);
          tmp2__hi_.m_hi = yp;
        }
        else {
          dVar2 = Interval::lo(y);
          pdStack_e8 = &val_hi_.m_hi;
          do {
            ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst_ + 4));
            point_lo_.m_hi = (double)pdStack_e8;
            Interval::Interval((Interval *)auStack_110);
            Interval::Interval((Interval *)&point);
            local_140 = (undefined8 *)auStack_110;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            Interval::Interval((Interval *)&point_1,dVar1 * dVar2);
            puVar7 = local_140;
            local_140[2] = local_148;
            dVar5 = dStack_150;
            *puVar7 = point_1;
            puVar7[1] = dVar5;
            local_160 = &point;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            Interval::Interval((Interval *)&local_178,dVar1 * dVar2);
            ppIVar4 = local_160;
            local_160[2] = local_168;
            pIVar3 = pIStack_170;
            *ppIVar4 = local_178;
            ppIVar4[1] = pIVar3;
            Interval::operator|((Interval *)&yp_1,(Interval *)auStack_110,(Interval *)&point);
            *(double *)point_lo_.m_hi = yp_1;
            *(double *)((long)point_lo_.m_hi + 8) = local_188;
            *(double *)((long)point_lo_.m_hi + 0x10) = local_180;
            ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst_ + 4));
            dVar10 = ::deGetFalse();
          } while (dVar10 != 0);
          dVar2 = Interval::hi(y);
          puStack_1a0 = (undefined8 *)local_c0;
          do {
            ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst__1 + 4));
            puVar7 = puStack_1a0;
            Interval::Interval((Interval *)&point_hi__1.m_hi);
            Interval::Interval((Interval *)&point_2);
            local_1e8 = &point_hi__1.m_hi;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            Interval::Interval((Interval *)&point_3,dVar1 * dVar2);
            pdVar6 = local_1e8;
            local_1e8[2] = local_1f0;
            dVar5 = dStack_1f8;
            *pdVar6 = (double)point_3;
            pdVar6[1] = dVar5;
            local_208 = &point_2;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            Interval::Interval((Interval *)&local_220,dVar1 * dVar2);
            ppIVar4 = local_208;
            local_208[2] = local_210;
            pIVar3 = pIStack_218;
            *ppIVar4 = local_220;
            ppIVar4[1] = pIVar3;
            Interval::operator|(&local_238,(Interval *)&point_hi__1.m_hi,(Interval *)&point_2);
            *puVar7 = local_238._0_8_;
            puVar7[1] = local_238.m_lo;
            puVar7[2] = local_238.m_hi;
            ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst__1 + 4))
            ;
            dVar10 = ::deGetFalse();
          } while (dVar10 != 0);
          Interval::operator|((Interval *)local_250,(Interval *)&val_hi_.m_hi,(Interval *)local_c0);
          tmp2__hi_.m_hi = local_250[0];
        }
        bVar9 = Interval::hasNaN(y);
        if (bVar9) {
          fVar11 = std::numeric_limits<float>::quiet_NaN();
          Interval::Interval((Interval *)&xp_1,(double)fVar11);
          Interval::operator|=((Interval *)&tmp2__hi_.m_hi,(Interval *)&xp_1);
        }
        dVar10 = ::deGetFalse();
      } while (dVar10 != 0);
      dVar1 = Interval::hi(x);
      do {
        Interval::Interval((Interval *)&val_hi__1.m_hi);
        Interval::Interval((Interval *)local_2b8);
        bVar9 = Interval::empty(y);
        if (bVar9) {
          Interval::Interval((Interval *)&yp_2);
          local_58 = yp_2;
          tmp2__hi_._0_8_ = local_2c8;
          tmp2__hi_.m_lo = local_2c0;
        }
        else {
          dVar2 = Interval::lo(y);
          pdStack_2e0 = &val_hi__1.m_hi;
          do {
            ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst__2 + 4));
            pdVar8 = pdStack_2e0;
            Interval::Interval((Interval *)&point_hi__2.m_hi);
            Interval::Interval((Interval *)&point_4);
            local_328 = &point_hi__2.m_hi;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            Interval::Interval((Interval *)&point_5,dVar1 * dVar2);
            pdVar6 = local_328;
            local_328[2] = local_330;
            dVar5 = dStack_338;
            *pdVar6 = (double)point_5;
            pdVar6[1] = dVar5;
            local_348 = &point_4;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            Interval::Interval((Interval *)&local_360,dVar1 * dVar2);
            ppIVar4 = local_348;
            local_348[2] = local_350;
            pIVar3 = pIStack_358;
            *ppIVar4 = local_360;
            ppIVar4[1] = pIVar3;
            Interval::operator|((Interval *)&yp_3,(Interval *)&point_hi__2.m_hi,(Interval *)&point_4
                               );
            *pdVar8 = yp_3;
            pdVar8[1] = local_370;
            pdVar8[2] = local_368;
            ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst__2 + 4))
            ;
            dVar10 = ::deGetFalse();
          } while (dVar10 != 0);
          dVar2 = Interval::hi(y);
          puStack_388 = (undefined8 *)local_2b8;
          do {
            ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst__3 + 4));
            puVar7 = puStack_388;
            Interval::Interval((Interval *)&point_hi__3.m_hi);
            Interval::Interval((Interval *)&point_6);
            local_3d0 = &point_hi__3.m_hi;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            Interval::Interval((Interval *)&point_7,dVar1 * dVar2);
            pdVar6 = local_3d0;
            local_3d0[2] = local_3d8;
            dVar5 = dStack_3e0;
            *pdVar6 = (double)point_7;
            pdVar6[1] = dVar5;
            local_3f0 = &point_6;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            Interval::Interval((Interval *)&local_408,dVar1 * dVar2);
            ppIVar4 = local_3f0;
            local_3f0[2] = local_3f8;
            pIVar3 = pIStack_400;
            *ppIVar4 = local_408;
            ppIVar4[1] = pIVar3;
            Interval::operator|(&local_420,(Interval *)&point_hi__3.m_hi,(Interval *)&point_6);
            *puVar7 = local_420._0_8_;
            puVar7[1] = local_420.m_lo;
            puVar7[2] = local_420.m_hi;
            ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst__3 + 4))
            ;
            dVar10 = ::deGetFalse();
          } while (dVar10 != 0);
          Interval::operator|((Interval *)&local_438,(Interval *)&val_hi__1.m_hi,
                              (Interval *)local_2b8);
          local_58 = local_438;
          tmp2__hi_._0_8_ = local_430;
          tmp2__hi_.m_lo = local_428;
        }
        bVar9 = Interval::hasNaN(y);
        if (bVar9) {
          fVar11 = std::numeric_limits<float>::quiet_NaN();
          Interval::Interval(&local_450,(double)fVar11);
          Interval::operator|=((Interval *)&local_58,&local_450);
        }
        dVar10 = ::deGetFalse();
      } while (dVar10 != 0);
      Interval::operator|(&local_468,(Interval *)&tmp2__hi_.m_hi,(Interval *)&local_58);
      __return_storage_ptr__->m_hasNaN = local_468.m_hasNaN;
      *(undefined7 *)&__return_storage_ptr__->field_0x1 = local_468._1_7_;
      __return_storage_ptr__->m_lo = local_468.m_lo;
      __return_storage_ptr__->m_hi = local_468.m_hi;
    }
    bVar9 = Interval::hasNaN(x);
    if (bVar9) {
      fVar11 = std::numeric_limits<float>::quiet_NaN();
      Interval::Interval(&local_480,(double)fVar11);
      Interval::operator|=(__return_storage_ptr__,&local_480);
    }
    dVar10 = ::deGetFalse();
  } while (dVar10 != 0);
  return __return_storage_ptr__;
}

Assistant:

Interval operator* (const Interval& x, const Interval& y)
{
	Interval ret;

	TCU_INTERVAL_APPLY_MONOTONE2(ret, xp, x, yp, y, val,
								 TCU_SET_INTERVAL(val, point, point = xp * yp));
	return ret;
}